

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O0

int nn_condvar_init(nn_condvar_t *cond)

{
  int iVar1;
  pthread_cond_t *in_RDI;
  int rc;
  
  iVar1 = pthread_cond_init(in_RDI,(pthread_condattr_t *)0x0);
  return -iVar1;
}

Assistant:

int nn_condvar_init (nn_condvar_t *cond)
{
    int rc;

    /* This should really never fail, but the system may do so for
       ENOMEM or EAGAIN due to resource exhaustion, or EBUSY if reusing
       a condition variable with no intervening destroy call. */
    rc = pthread_cond_init (&cond->cv, NULL);
    return (-rc);
}